

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O2

bool __thiscall
libmatroska::KaxBlockGroup::GetBlockDuration(KaxBlockGroup *this,uint64 *TheTimecode)

{
  EbmlUInteger *this_00;
  uint64 uVar1;
  uint64 uVar2;
  
  this_00 = (EbmlUInteger *)
            libebml::EbmlMaster::FindElt
                      (&this->super_EbmlMaster,(EbmlCallbacks *)KaxBlockDuration::ClassInfos);
  if (this_00 != (EbmlUInteger *)0x0) {
    if (this->ParentTrack == (KaxTrackEntry *)0x0) {
      __assert_fail("ParentTrack != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0x372,"bool libmatroska::KaxBlockGroup::GetBlockDuration(uint64 &) const");
    }
    uVar1 = libebml::EbmlUInteger::operator_cast_to_unsigned_long(this_00);
    uVar2 = KaxTrackEntry::GlobalTimecodeScale(this->ParentTrack);
    *TheTimecode = uVar2 * uVar1;
  }
  return this_00 != (EbmlUInteger *)0x0;
}

Assistant:

bool KaxBlockGroup::GetBlockDuration(uint64 &TheTimecode) const
{
  KaxBlockDuration * myDuration = static_cast<KaxBlockDuration *>(FindElt(EBML_INFO(KaxBlockDuration)));
  if (myDuration == NULL) {
    return false;
  }

  assert(ParentTrack != NULL);
  TheTimecode = uint64(*myDuration) * ParentTrack->GlobalTimecodeScale();
  return true;
}